

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileProfilingData.cxx
# Opt level: O0

void __thiscall
cmMakefileProfilingData::StartEntry
          (cmMakefileProfilingData *this,string *category,string *name,optional<Json::Value> *args)

{
  bool bVar1;
  ulong uVar2;
  streamoff sVar3;
  Value *pVVar4;
  UInt64 value;
  longlong lVar5;
  Value *this_00;
  pointer pSVar6;
  failure *fail;
  Value local_180;
  Value local_158;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_130;
  duration<long,_std::ratio<1L,_1000000000L>_> local_128;
  duration<long,_std::ratio<1L,_1000000L>_> local_120;
  Value local_118;
  Value local_f0;
  Value local_c8;
  Value local_a0;
  undefined1 local_78 [8];
  Value v;
  SystemInformation info;
  fpos local_38 [16];
  optional<Json::Value> *local_28;
  optional<Json::Value> *args_local;
  string *name_local;
  string *category_local;
  cmMakefileProfilingData *this_local;
  
  local_28 = args;
  args_local = (optional<Json::Value> *)name;
  name_local = category;
  category_local = (string *)this;
  uVar2 = std::ios::good();
  if ((uVar2 & 1) != 0) {
    local_38 = (fpos  [16])std::ostream::tellp();
    sVar3 = std::fpos::operator_cast_to_long(local_38);
    if (1 < sVar3) {
      std::operator<<((ostream *)this,",");
    }
    cmsys::SystemInformation::SystemInformation((SystemInformation *)&v.limit_);
    Json::Value::Value((Value *)local_78,nullValue);
    Json::Value::Value(&local_a0,"B");
    pVVar4 = Json::Value::operator[]((Value *)local_78,"ph");
    Json::Value::operator=(pVVar4,&local_a0);
    Json::Value::~Value(&local_a0);
    Json::Value::Value(&local_c8,(String *)args_local);
    pVVar4 = Json::Value::operator[]((Value *)local_78,"name");
    Json::Value::operator=(pVVar4,&local_c8);
    Json::Value::~Value(&local_c8);
    Json::Value::Value(&local_f0,name_local);
    pVVar4 = Json::Value::operator[]((Value *)local_78,"cat");
    Json::Value::operator=(pVVar4,&local_f0);
    Json::Value::~Value(&local_f0);
    local_130.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
    local_128.__r =
         (rep_conflict)
         std::chrono::
         time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
         ::time_since_epoch(&local_130);
    local_120.__r =
         (rep_conflict)
         std::chrono::
         duration_cast<std::chrono::duration<long,std::ratio<1l,1000000l>>,long,std::ratio<1l,1000000000l>>
                   (&local_128);
    value = std::chrono::duration<long,_std::ratio<1L,_1000000L>_>::count(&local_120);
    Json::Value::Value(&local_118,value);
    pVVar4 = Json::Value::operator[]((Value *)local_78,"ts");
    Json::Value::operator=(pVVar4,&local_118);
    Json::Value::~Value(&local_118);
    lVar5 = cmsys::SystemInformation::GetProcessId((SystemInformation *)&v.limit_);
    Json::Value::Value(&local_158,(Int)lVar5);
    pVVar4 = Json::Value::operator[]((Value *)local_78,"pid");
    Json::Value::operator=(pVVar4,&local_158);
    Json::Value::~Value(&local_158);
    Json::Value::Value(&local_180,0);
    pVVar4 = Json::Value::operator[]((Value *)local_78,"tid");
    Json::Value::operator=(pVVar4,&local_180);
    Json::Value::~Value(&local_180);
    bVar1 = std::optional::operator_cast_to_bool((optional *)args);
    if (bVar1) {
      pVVar4 = std::optional<Json::Value>::operator*(args);
      this_00 = Json::Value::operator[]((Value *)local_78,"args");
      Json::Value::operator=(this_00,pVVar4);
    }
    pSVar6 = std::unique_ptr<Json::StreamWriter,_std::default_delete<Json::StreamWriter>_>::
             operator->(&this->JsonWriter);
    (*pSVar6->_vptr_StreamWriter[2])(pSVar6,local_78,this);
    Json::Value::~Value((Value *)local_78);
    cmsys::SystemInformation::~SystemInformation((SystemInformation *)&v.limit_);
  }
  return;
}

Assistant:

void cmMakefileProfilingData::StartEntry(const std::string& category,
                                         const std::string& name,
                                         cm::optional<Json::Value> args)
{
  /* Do not try again if we previously failed to write to output. */
  if (!this->ProfileStream.good()) {
    return;
  }

  try {
    if (this->ProfileStream.tellp() > 1) {
      this->ProfileStream << ",";
    }
    cmsys::SystemInformation info;
    Json::Value v;
    v["ph"] = "B";
    v["name"] = name;
    v["cat"] = category;
    v["ts"] = static_cast<Json::Value::UInt64>(
      std::chrono::duration_cast<std::chrono::microseconds>(
        std::chrono::steady_clock::now().time_since_epoch())
        .count());
    v["pid"] = static_cast<int>(info.GetProcessId());
    v["tid"] = 0;
    if (args) {
      v["args"] = *std::move(args);
    }

    this->JsonWriter->write(v, &this->ProfileStream);
  } catch (std::ios_base::failure& fail) {
    cmSystemTools::Error(
      cmStrCat("Failed to write to profiling output: ", fail.what()));
  } catch (...) {
    cmSystemTools::Error("Error writing profiling output!");
  }
}